

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O1

XXH128_hash_t
XXH128_mix32B(XXH128_hash_t acc,xxh_u8 *input_1,xxh_u8 *input_2,xxh_u8 *secret,XXH64_hash_t seed)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  XXH128_hash_t XVar5;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(long *)(secret + 8) - seed ^ *(ulong *)(input_1 + 8);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(long *)secret + seed ^ *(ulong *)input_1;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(long *)(secret + 0x18) - seed ^ *(ulong *)(input_2 + 8);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = seed + *(long *)(secret + 0x10) ^ *(ulong *)input_2;
  XVar5.high64 = (SUB168(auVar2 * auVar4,8) ^ SUB168(auVar2 * auVar4,0)) + acc.high64 ^
                 *(ulong *)(input_1 + 8) + *(ulong *)input_1;
  XVar5.low64 = (SUB168(auVar1 * auVar3,0) ^ SUB168(auVar1 * auVar3,8)) + acc.low64 ^
                *(ulong *)(input_2 + 8) + *(ulong *)input_2;
  return XVar5;
}

Assistant:

static xxh_u64 XXH_read64(const void* memPtr) {
  xxh_u64 val;
  memcpy(&val, memPtr, sizeof(val));
  return val;
}